

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O3

void Gia_ManPrintStatsMiter(Gia_Man_t *p,int fVerbose)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  Vec_Flt_t *__ptr;
  Vec_Int_t *pVVar6;
  int *piVar7;
  ulong uVar8;
  Gia_Obj_t *pGVar9;
  int iVar10;
  size_t __size;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iObjId;
  int local_4c;
  long local_48;
  Vec_Flt_t *local_40;
  Gia_Man_t *local_38;
  
  Gia_ManLevelNum(p);
  Gia_ManCreateRefs(p);
  __ptr = Gia_ManPrintOutputProb(p);
  puts("Statistics for each outputs of the miter:");
  pVVar6 = p->vCos;
  uVar8 = (ulong)(uint)pVVar6->nSize;
  if (p->nRegs < pVVar6->nSize) {
    uVar13 = 0;
    local_40 = __ptr;
    local_38 = p;
    do {
      if ((long)(int)uVar8 <= (long)uVar13) goto LAB_006ee31f;
      iVar1 = pVVar6->pArray[uVar13];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar9 = p->pObjs;
      if (pGVar9 == (Gia_Obj_t *)0x0) break;
      local_4c = iVar1;
      printf("%4d : ",uVar13 & 0xffffffff);
      iVar4 = local_4c;
      lVar12 = (long)local_4c;
      pVVar6 = p->vLevels;
      iVar10 = pVVar6->nSize;
      if (iVar10 <= local_4c) {
        lVar11 = lVar12 + 1;
        iVar2 = pVVar6->nCap;
        lVar3 = (long)iVar2 * 2;
        if (local_4c < (int)lVar3) {
          if (iVar2 <= local_4c) {
            __size = (long)iVar2 << 3;
            local_48 = lVar11;
            if (pVVar6->pArray == (int *)0x0) {
              piVar7 = (int *)malloc(__size);
            }
            else {
              piVar7 = (int *)realloc(pVVar6->pArray,__size);
            }
            pVVar6->pArray = piVar7;
            lVar11 = local_48;
joined_r0x006ee199:
            if (piVar7 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            pVVar6->nCap = (int)lVar3;
            iVar10 = pVVar6->nSize;
          }
        }
        else if (iVar2 <= local_4c) {
          if (pVVar6->pArray == (int *)0x0) {
            piVar7 = (int *)malloc(lVar11 * 4);
          }
          else {
            piVar7 = (int *)realloc(pVVar6->pArray,lVar11 * 4);
          }
          pVVar6->pArray = piVar7;
          lVar3 = lVar11;
          goto joined_r0x006ee199;
        }
        if (iVar10 <= iVar4) {
          memset(pVVar6->pArray + iVar10,0,(ulong)(uint)(iVar4 - iVar10) * 4 + 4);
        }
        iVar10 = (int)lVar11;
        pVVar6->nSize = iVar10;
      }
      if ((iVar4 < 0) || (iVar10 <= iVar4)) {
LAB_006ee31f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pGVar9 = pGVar9 + iVar1;
      printf("Level = %5d  ",(ulong)(uint)pVVar6->pArray[lVar12]);
      p = local_38;
      uVar5 = Gia_ManSuppSize(local_38,&local_4c,1);
      printf("Supp = %5d  ",(ulong)uVar5);
      uVar5 = Gia_ManConeSize(p,&local_4c,1);
      printf("Cone = %5d  ",(ulong)uVar5);
      uVar5 = Gia_NodeMffcSize(p,pGVar9 + -(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff));
      printf("Mffc = %5d  ",(ulong)uVar5);
      __ptr = local_40;
      if (((long)local_4c < 0) || (local_40->nSize <= local_4c)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
                      ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
      }
      printf("Prob = %8.4f  ",(double)local_40->pArray[local_4c]);
      putchar(10);
      uVar13 = uVar13 + 1;
      pVVar6 = p->vCos;
      uVar8 = (ulong)pVVar6->nSize;
    } while ((long)uVar13 < (long)(uVar8 - (long)p->nRegs));
  }
  if (__ptr->pArray != (float *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return;
}

Assistant:

void Gia_ManPrintStatsMiter( Gia_Man_t * p, int fVerbose )
{
    Gia_Obj_t * pObj;
    Vec_Flt_t * vProb;
    int i, iObjId;
    Gia_ManLevelNum( p );
    Gia_ManCreateRefs( p );
    vProb = Gia_ManPrintOutputProb( p );
    printf( "Statistics for each outputs of the miter:\n" );
    Gia_ManForEachPo( p, pObj, i )
    {
        iObjId = Gia_ObjId(p, pObj);
        printf( "%4d : ", i );
        printf( "Level = %5d  ",  Gia_ObjLevelId(p, iObjId) );
        printf( "Supp = %5d  ",   Gia_ManSuppSize(p, &iObjId, 1) );
        printf( "Cone = %5d  ",   Gia_ManConeSize(p, &iObjId, 1) );
        printf( "Mffc = %5d  ",   Gia_NodeMffcSize(p, Gia_ObjFanin0(pObj)) );
        printf( "Prob = %8.4f  ", Vec_FltEntry(vProb, iObjId) );
        printf( "\n" );
    }
    Vec_FltFree( vProb );
}